

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

bool cmState::ParseCacheEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  char *pcVar1;
  bool bVar2;
  CacheEntryType CVar3;
  int iVar4;
  RegularExpression *this;
  string local_50;
  
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::reg == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::reg), iVar4 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseCacheEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::reg);
  }
  if ((ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                                   ::regQuoted), iVar4 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseCacheEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseCacheEntry::regQuoted,
                 &__dso_handle);
    __cxa_guard_release(&ParseCacheEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmStateEnums::CacheEntryType&)
                         ::regQuoted);
  }
  bVar2 = cmsys::RegularExpression::find(&ParseCacheEntry::regQuoted,entry);
  if (bVar2) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_
              (&local_50,&ParseCacheEntry::regQuoted.regmatch,1);
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmsys::RegularExpressionMatch::match_abi_cxx11_
              (&local_50,&ParseCacheEntry::regQuoted.regmatch,2);
    CVar3 = StringToCacheEntryType(&local_50);
    *type = CVar3;
    std::__cxx11::string::~string((string *)&local_50);
    this = &ParseCacheEntry::regQuoted;
  }
  else {
    bVar2 = cmsys::RegularExpression::find(&ParseCacheEntry::reg,entry);
    if (!bVar2) {
      if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
           ::reg == '\0') &&
         (iVar4 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                       ::reg), iVar4 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  ((RegularExpression *)
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                     ::reg,&__dso_handle);
        __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                             ::reg);
      }
      if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
           ::regQuoted == '\0') &&
         (iVar4 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                       ::regQuoted), iVar4 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  ((RegularExpression *)
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                     ::regQuoted,&__dso_handle);
        __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                             ::regQuoted);
      }
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::regQuoted,entry);
      if (bVar2) {
        this = (RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::regQuoted;
      }
      else {
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)
                           ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::reg,entry);
        if (!bVar2) {
          return false;
        }
        this = (RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::reg;
      }
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&this->regmatch,1);
      std::__cxx11::string::operator=((string *)var,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      iVar4 = 2;
      goto LAB_00331be0;
    }
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&ParseCacheEntry::reg.regmatch,1);
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&ParseCacheEntry::reg.regmatch,2);
    CVar3 = StringToCacheEntryType(&local_50);
    *type = CVar3;
    std::__cxx11::string::~string((string *)&local_50);
    this = &ParseCacheEntry::reg;
  }
  iVar4 = 3;
LAB_00331be0:
  cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_50,&this->regmatch,iVar4);
  std::__cxx11::string::operator=((string *)value,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (((1 < value->_M_string_length) && (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
     (pcVar1[value->_M_string_length - 1] == '\'')) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return true;
}

Assistant:

bool cmState::ParseCacheEntry(const std::string& entry, std::string& var,
                              std::string& value,
                              cmStateEnums::CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if (regQuoted.find(entry)) {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2));
    value = regQuoted.match(3);
    flag = true;
  } else if (reg.find(entry)) {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2));
    value = reg.match(3);
    flag = true;
  }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag && value.size() >= 2 && value.front() == '\'' &&
      value.back() == '\'') {
    value = value.substr(1, value.size() - 2);
  }

  if (!flag) {
    return ParseEntryWithoutType(entry, var, value);
  }

  return flag;
}